

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O3

bool cppjieba::DecodeRunesInString(char *s,size_t len,RuneStrArray *runes)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  ulong uVar8;
  RuneStr x;
  RuneStr local_44;
  
  if ((RuneStrArray *)runes->ptr_ != runes) {
    free((RuneStrArray *)runes->ptr_);
  }
  runes->ptr_ = runes->buffer_;
  runes->size_ = 0;
  runes->capacity_ = 0x10;
  limonp::LocalVector<cppjieba::RuneStr>::reserve(runes,len >> 1);
  if (len != 0) {
    uVar8 = 0;
    uVar5 = 0;
    do {
      if (s == (char *)0x0) {
LAB_001120e5:
        if ((RuneStrArray *)runes->ptr_ != runes) {
          free((RuneStrArray *)runes->ptr_);
        }
        runes->ptr_ = runes->buffer_;
        runes->size_ = 0;
        runes->capacity_ = 0x10;
        return false;
      }
      pbVar1 = (byte *)(s + uVar8);
      bVar2 = *pbVar1;
      uVar3 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        uVar4 = len - uVar8;
        uVar3 = (uint)bVar2;
        if (uVar4 < 2 || 0xdf < bVar2) {
          if (uVar4 < 3 || 0xef < bVar2) {
            if ((uVar4 < 4) || (0xf7 < bVar2)) goto LAB_001120e5;
            uVar3 = (pbVar1[2] & 0x3f) << 6 | (pbVar1[1] & 0x3f | (uVar3 & 7) << 6) << 0xc;
            lVar7 = 3;
            uVar6 = 4;
          }
          else {
            uVar3 = (pbVar1[1] & 0x3f | (uVar3 & 0xf) << 6) << 6;
            lVar7 = 2;
            uVar6 = 3;
          }
        }
        else {
          uVar3 = (uVar3 & 0x1f) << 6;
          lVar7 = 1;
          uVar6 = 2;
        }
        uVar3 = pbVar1[lVar7] & 0x3f | uVar3;
      }
      else {
        uVar6 = 1;
      }
      local_44.unicode_length = 1;
      local_44.rune = uVar3;
      local_44.offset = (uint32_t)uVar8;
      local_44.len = uVar6;
      local_44.unicode_offset = uVar5;
      limonp::LocalVector<cppjieba::RuneStr>::push_back(runes,&local_44);
      uVar8 = (ulong)((uint32_t)uVar8 + uVar6);
      uVar5 = uVar5 + 1;
    } while (uVar8 < len);
  }
  return true;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, RuneStrArray& runes) {
  runes.clear();
  runes.reserve(len / 2);
  for (uint32_t i = 0, j = 0; i < len;) {
    RuneStrLite rp = DecodeRuneInString(s + i, len - i);
    if (rp.len == 0) {
      runes.clear();
      return false;
    }
    RuneStr x(rp.rune, i, rp.len, j, 1);
    runes.push_back(x);
    i += rp.len;
    ++j;
  }
  return true;
}